

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

ssize_t zisofs_extract(archive_write *a,zisofs_extract *zisofs,uchar *p,size_t bytes)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  uint uVar4;
  uchar *puVar5;
  size_t local_68;
  size_t wsize;
  size_t size;
  uchar *wb;
  uint32_t bed;
  uint32_t bst;
  ssize_t rs;
  size_t sStack_38;
  int r;
  size_t avail;
  size_t bytes_local;
  uchar *p_local;
  zisofs_extract *zisofs_local;
  archive_write *a_local;
  
  sStack_38 = bytes;
  bytes_local = (size_t)p;
  if (-1 < (char)(zisofs->field_0x18 << 7)) {
    sStack_38 = zisofs_extract_init(a,zisofs,p,bytes);
    if ((long)sStack_38 < 0) {
      return sStack_38;
    }
    if (-1 < (char)(zisofs->field_0x18 << 7)) {
      zisofs->pz_offset = (int)bytes + zisofs->pz_offset;
      return bytes;
    }
    bytes_local = (size_t)(p + (bytes - sStack_38));
  }
  if (zisofs->block_avail == 0) {
    if (zisofs->block_pointers_size <= zisofs->block_off + 4) {
      archive_set_error(&a->archive,0x54,"Illegal zisofs block pointers");
      return -0x1e;
    }
    uVar1 = archive_le32dec(zisofs->block_pointers + zisofs->block_off);
    if ((ulong)uVar1 != (ulong)zisofs->pz_offset + (bytes - sStack_38)) {
      archive_set_error(&a->archive,0x54,"Illegal zisofs block pointers(cannot seek)");
      return -0x1e;
    }
    uVar2 = archive_le32dec(zisofs->block_pointers + zisofs->block_off + 4);
    if (uVar2 < uVar1) {
      archive_set_error(&a->archive,0x54,"Illegal zisofs block pointers");
      return -0x1e;
    }
    zisofs->block_avail = uVar2 - uVar1;
    zisofs->block_off = zisofs->block_off + 4;
    if (zisofs->stream_valid == 0) {
      rs._4_4_ = cm_zlib_inflateInit_(&zisofs->stream,"1.2.12",0x70);
    }
    else {
      rs._4_4_ = cm_zlib_inflateReset(&zisofs->stream);
    }
    if (rs._4_4_ != 0) {
      archive_set_error(&a->archive,-1,"Can\'t initialize zisofs decompression.");
      return -0x1e;
    }
    zisofs->stream_valid = 1;
    (zisofs->stream).total_in = 0;
    (zisofs->stream).total_out = 0;
  }
  if (zisofs->block_avail == 0) {
    for (wsize = zisofs->uncompressed_buffer_size; wsize != 0; wsize = wsize - local_68) {
      puVar5 = wb_buffptr(a);
      if (*(ulong *)((long)a->format_data + 0x102e0) < wsize) {
        local_68 = *(size_t *)((long)a->format_data + 0x102e0);
      }
      else {
        local_68 = wsize;
      }
      memset(puVar5,0,local_68);
      iVar3 = wb_consume(a,local_68);
      if (iVar3 < 0) {
        return (long)iVar3;
      }
    }
  }
  else {
    (zisofs->stream).next_in = (Bytef *)bytes_local;
    if (zisofs->block_avail < sStack_38) {
      (zisofs->stream).avail_in = zisofs->block_avail;
    }
    else {
      (zisofs->stream).avail_in = (uInt)sStack_38;
    }
    puVar5 = wb_buffptr(a);
    (zisofs->stream).next_out = puVar5;
    (zisofs->stream).avail_out = *(uInt *)((long)a->format_data + 0x102e0);
    uVar4 = cm_zlib_inflate(&zisofs->stream,0);
    if (1 < uVar4) {
      archive_set_error(&a->archive,-1,"zisofs decompression failed (%d)",(ulong)uVar4);
      return -0x1e;
    }
    sStack_38 = sStack_38 - ((long)(zisofs->stream).next_in - bytes_local);
    zisofs->block_avail = zisofs->block_avail - ((int)(zisofs->stream).next_in - (int)bytes_local);
    iVar3 = wb_consume(a,*(long *)((long)a->format_data + 0x102e0) -
                         (ulong)(zisofs->stream).avail_out);
    if (iVar3 < 0) {
      return (long)iVar3;
    }
  }
  zisofs->pz_offset = (int)bytes + zisofs->pz_offset;
  return bytes - sStack_38;
}

Assistant:

static ssize_t
zisofs_extract(struct archive_write *a, struct zisofs_extract *zisofs,
    const unsigned char *p, size_t bytes)
{
	size_t avail;
	int r;

	if (!zisofs->initialized) {
		ssize_t rs = zisofs_extract_init(a, zisofs, p, bytes);
		if (rs < 0)
			return (rs);
		if (!zisofs->initialized) {
			/* We need more data. */
			zisofs->pz_offset += (uint32_t)bytes;
			return (bytes);
		}
		avail = rs;
		p += bytes - avail;
	} else
		avail = bytes;

	/*
	 * Get block offsets from block pointers.
	 */
	if (zisofs->block_avail == 0) {
		uint32_t bst, bed;

		if (zisofs->block_off + 4 >= zisofs->block_pointers_size) {
			/* There isn't a pair of offsets. */
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Illegal zisofs block pointers");
			return (ARCHIVE_FATAL);
		}
		bst = archive_le32dec(
		    zisofs->block_pointers + zisofs->block_off);
		if (bst != zisofs->pz_offset + (bytes - avail)) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Illegal zisofs block pointers(cannot seek)");
			return (ARCHIVE_FATAL);
		}
		bed = archive_le32dec(
		    zisofs->block_pointers + zisofs->block_off + 4);
		if (bed < bst) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Illegal zisofs block pointers");
			return (ARCHIVE_FATAL);
		}
		zisofs->block_avail = bed - bst;
		zisofs->block_off += 4;

		/* Initialize compression library for new block. */
		if (zisofs->stream_valid)
			r = inflateReset(&zisofs->stream);
		else
			r = inflateInit(&zisofs->stream);
		if (r != Z_OK) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Can't initialize zisofs decompression.");
			return (ARCHIVE_FATAL);
		}
		zisofs->stream_valid = 1;
		zisofs->stream.total_in = 0;
		zisofs->stream.total_out = 0;
	}

	/*
	 * Make uncompressed data.
	 */
	if (zisofs->block_avail == 0) {
		/*
		 * It's basically 32K bytes NUL data.
		 */
		unsigned char *wb;
		size_t size, wsize;

		size = zisofs->uncompressed_buffer_size;
		while (size) {
			wb = wb_buffptr(a);
			if (size > wb_remaining(a))
				wsize = wb_remaining(a);
			else
				wsize = size;
			memset(wb, 0, wsize);
			r = wb_consume(a, wsize);
			if (r < 0)
				return (r);
			size -= wsize;
		}
	} else {
		zisofs->stream.next_in = (Bytef *)(uintptr_t)(const void *)p;
		if (avail > zisofs->block_avail)
			zisofs->stream.avail_in = zisofs->block_avail;
		else
			zisofs->stream.avail_in = (uInt)avail;
		zisofs->stream.next_out = wb_buffptr(a);
		zisofs->stream.avail_out = (uInt)wb_remaining(a);

		r = inflate(&zisofs->stream, 0);
		switch (r) {
		case Z_OK: /* Decompressor made some progress.*/
		case Z_STREAM_END: /* Found end of stream. */
			break;
		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "zisofs decompression failed (%d)", r);
			return (ARCHIVE_FATAL);
		}
		avail -= zisofs->stream.next_in - p;
		zisofs->block_avail -= (uint32_t)(zisofs->stream.next_in - p);
		r = wb_consume(a, wb_remaining(a) - zisofs->stream.avail_out);
		if (r < 0)
			return (r);
	}
	zisofs->pz_offset += (uint32_t)bytes;
	return (bytes - avail);
}